

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

target_ulong helper_mftc0_cause_mips64el(CPUMIPSState_conflict5 *env)

{
  CPUMIPSState_conflict5 *pCVar1;
  CPUMIPSState_conflict5 *other;
  int32_t tccause;
  int other_tc;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  _tccause = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  if (other._4_4_ == pCVar1->current_tc) {
    other._0_4_ = pCVar1->CP0_Cause;
  }
  else {
    other._0_4_ = pCVar1->CP0_Cause;
  }
  return (long)(int32_t)other;
}

Assistant:

target_ulong helper_mftc0_cause(CPUMIPSState *env)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    int32_t tccause;
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        tccause = other->CP0_Cause;
    } else {
        tccause = other->CP0_Cause;
    }

    return tccause;
}